

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

void __thiscall
fmt::v11::format_facet<std::locale>::format_facet(format_facet<std::locale> *this,locale *loc)

{
  numpunct *pnVar1;
  long *local_50 [2];
  long local_40 [2];
  
  *(undefined4 *)&this->field_0x8 = 0;
  *(undefined ***)this = &PTR__format_facet_00252c10;
  (this->separator_)._M_dataplus._M_p = (pointer)&(this->separator_).field_2;
  (this->separator_)._M_string_length = 0;
  (this->separator_).field_2._M_local_buf[0] = '\0';
  (this->grouping_)._M_dataplus._M_p = (pointer)&(this->grouping_).field_2;
  (this->grouping_)._M_string_length = 0;
  (this->grouping_).field_2._M_local_buf[0] = '\0';
  (this->decimal_point_)._M_dataplus._M_p = (pointer)&(this->decimal_point_).field_2;
  (this->decimal_point_)._M_string_length = 0;
  (this->decimal_point_).field_2._M_local_buf[0] = '\0';
  pnVar1 = std::use_facet<std::__cxx11::numpunct<char>>(loc);
  (**(code **)(*(long *)pnVar1 + 0x20))(local_50,pnVar1);
  std::__cxx11::string::operator=((string *)&this->grouping_,(string *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if ((this->grouping_)._M_string_length != 0) {
    (**(code **)(*(long *)pnVar1 + 0x18))(pnVar1);
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct((ulong)local_50,'\x01');
    std::__cxx11::string::operator=((string *)&this->separator_,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
  }
  return;
}

Assistant:

format_facet<Locale>::format_facet(Locale& loc) {
  auto& np = detail::use_facet<detail::numpunct<char>>(loc);
  grouping_ = np.grouping();
  if (!grouping_.empty()) separator_ = std::string(1, np.thousands_sep());
}